

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_file_utils.cpp
# Opt level: O0

bool crnlib::file_utils::does_file_exist(char *pFilename)

{
  int iVar1;
  undefined1 local_a8 [4];
  int result;
  stat stat_buf;
  char *pFilename_local;
  
  stat_buf.__glibc_reserved[2] = (__syscall_slong_t)pFilename;
  iVar1 = stat(pFilename,(stat *)local_a8);
  if (iVar1 == 0) {
    if (((uint)stat_buf.st_nlink & 0xf000) == 0x8000) {
      pFilename_local._7_1_ = true;
    }
    else {
      pFilename_local._7_1_ = false;
    }
  }
  else {
    pFilename_local._7_1_ = false;
  }
  return pFilename_local._7_1_;
}

Assistant:

bool file_utils::does_file_exist(const char* pFilename)
    {
        struct stat stat_buf;
        int result = stat(pFilename, &stat_buf);
        if (result)
        {
            return false;
        }
        if (S_ISREG(stat_buf.st_mode))
        {
            return true;
        }
        return false;
    }